

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t42parse.c
# Opt level: O3

void t42_parse_sfnts(T42_Face face,T42_Loader loader)

{
  byte bVar1;
  byte *pbVar2;
  FT_Byte *pFVar3;
  ulong uVar4;
  FT_Byte *pFVar5;
  FT_ULong *pFVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  FT_Offset new_count;
  ulong uVar11;
  FT_Memory memory;
  int iVar12;
  byte *pbVar13;
  ulong uVar14;
  FT_Error error;
  FT_ULong real_size;
  FT_Error local_70;
  uint local_6c;
  FT_Memory local_68;
  FT_Byte *local_60;
  byte *local_58;
  FT_Offset local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  pbVar2 = (loader->parser).root.limit;
  memory = (loader->parser).root.memory;
  (*(loader->parser).root.funcs.skip_spaces)((PS_Parser)loader);
  pbVar13 = (loader->parser).root.cursor;
  if ((pbVar13 < pbVar2) && ((loader->parser).root.cursor = pbVar13 + 1, *pbVar13 == 0x5b)) {
    (*(loader->parser).root.funcs.skip_spaces)((PS_Parser)loader);
    pbVar13 = (loader->parser).root.cursor;
    if (pbVar13 < pbVar2) {
      local_40 = 0;
      lVar10 = 0;
      iVar12 = 0;
      uVar11 = 0;
      local_50 = 0;
      uVar4 = 0;
      pFVar5 = (FT_Byte *)0x0;
      local_68 = memory;
      local_58 = pbVar2;
      do {
        memory = local_68;
        bVar1 = *pbVar13;
        if (bVar1 == 0x3c) {
          local_6c = (uint)uVar11;
          local_60 = pFVar5;
          (*(loader->parser).root.funcs.skip_PS_token)((PS_Parser)loader);
          pFVar5 = local_60;
          if ((loader->parser).root.error != 0) {
            uVar11 = (ulong)local_6c;
            goto LAB_0017b487;
          }
          pFVar3 = (loader->parser).root.cursor;
          if ((ulong)((long)pFVar3 - (long)pbVar13) < 3) {
            local_70 = 3;
          }
          else {
            new_count = (long)(pFVar3 + ~(ulong)pbVar13) / 2;
            pFVar5 = (FT_Byte *)ft_mem_realloc(memory,1,local_50,new_count,local_60,&local_70);
            memory = local_68;
            if (local_70 == 0) {
              (loader->parser).root.cursor = pbVar13;
              pFVar6 = &local_38;
              (*(loader->parser).root.funcs.to_bytes)
                        ((PS_Parser)loader,pFVar5,new_count,pFVar6,'\x01');
              uVar11 = CONCAT71((int7)((ulong)pFVar6 >> 8),1);
              uVar4 = local_38;
              goto LAB_0017b2a6;
            }
          }
LAB_0017b4cb:
          uVar11 = (ulong)local_6c;
          goto LAB_0017b483;
        }
        if (bVar1 == 0x5d) {
          (loader->parser).root.cursor = pbVar13 + 1;
          goto LAB_0017b487;
        }
        new_count = local_50;
        if (bVar1 - 0x30 < 10) {
          if ((char)uVar11 != '\0') break;
          uVar4 = (*(loader->parser).root.funcs.to_int)((PS_Parser)loader);
          if ((long)uVar4 < 0) {
            local_70 = 3;
            uVar11 = 0;
            goto LAB_0017b483;
          }
          (*(loader->parser).root.funcs.skip_PS_token)((PS_Parser)loader);
          if ((loader->parser).root.error != 0) {
            return;
          }
          pFVar3 = (loader->parser).root.cursor;
          pFVar5 = pFVar3 + 1;
          if ((ulong)((long)local_58 - (long)pFVar3) <= uVar4) goto LAB_0017b481;
          (loader->parser).root.cursor = pFVar3 + uVar4 + 1;
          uVar8 = 0;
          new_count = local_50;
        }
        else {
LAB_0017b2a6:
          uVar8 = (uint)uVar11;
          if (pFVar5 == (FT_Byte *)0x0) {
            local_70 = 3;
            pFVar5 = (FT_Byte *)0x0;
            memory = local_68;
            goto LAB_0017b483;
          }
        }
        local_50 = new_count;
        local_6c = uVar8;
        if ((uVar4 & 1) == 0) {
LAB_0017b2c8:
          if (uVar4 == 0) {
LAB_0017b4b9:
            local_70 = 3;
            memory = local_68;
            goto LAB_0017b4cb;
          }
        }
        else if (pFVar5[uVar4 - 1] == '\0') {
          uVar4 = uVar4 - 1;
          goto LAB_0017b2c8;
        }
        uVar11 = (long)local_58 - (long)(loader->parser).root.cursor;
        uVar14 = 0;
        local_60 = pFVar5;
        local_48 = uVar4;
        do {
          if (iVar12 == 2) {
LAB_0017b415:
            iVar12 = 2;
            if (face->ttf_size <= lVar10) goto LAB_0017b4b9;
          }
          else if (iVar12 == 1) {
LAB_0017b36f:
            lVar7 = face->ttf_size;
            iVar12 = 1;
            if (lVar7 <= lVar10) {
              if (0 < (int)local_40) {
                lVar9 = 0;
                do {
                  uVar8 = *(uint *)(face->ttf_data + lVar9 + 0x18);
                  uVar8 = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 |
                          uVar8 << 0x18;
                  if ((uVar11 < uVar8) || ((long)(uVar11 - uVar8) < lVar7)) goto LAB_0017b4b9;
                  lVar7 = lVar7 + (ulong)(uVar8 + 3 & 0xfffffffc);
                  face->ttf_size = lVar7;
                  lVar9 = lVar9 + 0x10;
                } while ((local_40 & 0xffffffff) << 4 != lVar9);
              }
              pFVar5 = (FT_Byte *)
                       ft_mem_realloc(local_68,1,(ulong)((int)local_40 << 4 | 0xc),lVar7 + 1,
                                      face->ttf_data,&local_70);
              face->ttf_data = pFVar5;
              uVar4 = local_48;
              memory = local_68;
              pFVar5 = local_60;
              if (local_70 == 0) goto LAB_0017b415;
              goto LAB_0017b4cb;
            }
          }
          else {
            iVar12 = 0;
            if (0xb < lVar10) {
              pFVar3 = face->ttf_data;
              uVar8 = (uint)pFVar3[5] + (uint)pFVar3[4] * 0x10;
              uVar4 = (ulong)(uVar8 * 0x10 | 0xc);
              face->ttf_size = uVar4;
              if ((long)uVar4 <= (long)uVar11) {
                local_40 = (ulong)uVar8;
                pFVar5 = (FT_Byte *)ft_mem_realloc(local_68,1,0xc,uVar4,pFVar3,&local_70);
                face->ttf_data = pFVar5;
                uVar4 = local_48;
                memory = local_68;
                pFVar5 = local_60;
                if (local_70 == 0) goto LAB_0017b36f;
                goto LAB_0017b4cb;
              }
              goto LAB_0017b4b9;
            }
          }
          face->ttf_data[lVar10] = pFVar5[uVar14];
          lVar10 = lVar10 + 1;
          uVar14 = uVar14 + 1;
        } while (uVar14 != uVar4);
        (*(loader->parser).root.funcs.skip_spaces)((PS_Parser)loader);
        pbVar13 = (loader->parser).root.cursor;
        uVar11 = (ulong)local_6c;
        uVar4 = local_48;
        memory = local_68;
        pFVar5 = local_60;
      } while (pbVar13 < local_58);
    }
    else {
      uVar11 = 0;
      pFVar5 = (FT_Byte *)0x0;
    }
    local_70 = 3;
  }
  else {
    pFVar5 = (FT_Byte *)0x0;
LAB_0017b481:
    local_70 = 3;
    uVar11 = 0;
  }
LAB_0017b483:
  (loader->parser).root.error = local_70;
LAB_0017b487:
  if ((char)uVar11 != '\0') {
    ft_mem_free(memory,pFVar5);
  }
  return;
}

Assistant:

static void
  t42_parse_sfnts( T42_Face    face,
                   T42_Loader  loader )
  {
    T42_Parser  parser = &loader->parser;
    FT_Memory   memory = parser->root.memory;
    FT_Byte*    cur;
    FT_Byte*    limit  = parser->root.limit;
    FT_Error    error;
    FT_Int      num_tables = 0;
    FT_Long     count;

    FT_ULong    n, string_size, old_string_size, real_size;
    FT_Byte*    string_buf = NULL;
    FT_Bool     allocated  = 0;

    T42_Load_Status  status;


    /* The format is                                */
    /*                                              */
    /*   /sfnts [ <hexstring> <hexstring> ... ] def */
    /*                                              */
    /* or                                           */
    /*                                              */
    /*   /sfnts [                                   */
    /*      <num_bin_bytes> RD <binary data>        */
    /*      <num_bin_bytes> RD <binary data>        */
    /*      ...                                     */
    /*   ] def                                      */
    /*                                              */
    /* with exactly one space after the `RD' token. */

    T1_Skip_Spaces( parser );

    if ( parser->root.cursor >= limit || *parser->root.cursor++ != '[' )
    {
      FT_ERROR(( "t42_parse_sfnts: can't find begin of sfnts vector\n" ));
      error = FT_THROW( Invalid_File_Format );
      goto Fail;
    }

    T1_Skip_Spaces( parser );
    status          = BEFORE_START;
    string_size     = 0;
    old_string_size = 0;
    count           = 0;

    while ( parser->root.cursor < limit )
    {
      FT_ULong  size;


      cur = parser->root.cursor;

      if ( *cur == ']' )
      {
        parser->root.cursor++;
        goto Exit;
      }

      else if ( *cur == '<' )
      {
        T1_Skip_PS_Token( parser );
        if ( parser->root.error )
          goto Exit;

        /* don't include delimiters */
        string_size = (FT_ULong)( ( parser->root.cursor - cur - 2 + 1 ) / 2 );
        if ( !string_size )
        {
          FT_ERROR(( "t42_parse_sfnts: invalid data in sfnts array\n" ));
          error = FT_THROW( Invalid_File_Format );
          goto Fail;
        }
        if ( FT_REALLOC( string_buf, old_string_size, string_size ) )
          goto Fail;

        allocated = 1;

        parser->root.cursor = cur;
        (void)T1_ToBytes( parser, string_buf, string_size, &real_size, 1 );
        old_string_size = string_size;
        string_size     = real_size;
      }

      else if ( ft_isdigit( *cur ) )
      {
        FT_Long  tmp;


        if ( allocated )
        {
          FT_ERROR(( "t42_parse_sfnts: "
                     "can't handle mixed binary and hex strings\n" ));
          error = FT_THROW( Invalid_File_Format );
          goto Fail;
        }

        tmp = T1_ToInt( parser );
        if ( tmp < 0 )
        {
          FT_ERROR(( "t42_parse_sfnts: invalid string size\n" ));
          error = FT_THROW( Invalid_File_Format );
          goto Fail;
        }
        else
          string_size = (FT_ULong)tmp;

        T1_Skip_PS_Token( parser );             /* `RD' */
        if ( parser->root.error )
          return;

        string_buf = parser->root.cursor + 1;   /* one space after `RD' */

        if ( (FT_ULong)( limit - parser->root.cursor ) <= string_size )
        {
          FT_ERROR(( "t42_parse_sfnts: too much binary data\n" ));
          error = FT_THROW( Invalid_File_Format );
          goto Fail;
        }
        else
          parser->root.cursor += string_size + 1;
      }

      if ( !string_buf )
      {
        FT_ERROR(( "t42_parse_sfnts: invalid data in sfnts array\n" ));
        error = FT_THROW( Invalid_File_Format );
        goto Fail;
      }

      /* A string can have a trailing zero (odd) byte for padding. */
      /* Ignore it.                                                */
      if ( ( string_size & 1 ) && string_buf[string_size - 1] == 0 )
        string_size--;

      if ( !string_size )
      {
        FT_ERROR(( "t42_parse_sfnts: invalid string\n" ));
        error = FT_THROW( Invalid_File_Format );
        goto Fail;
      }

      /* The whole TTF is now loaded into `string_buf'.  We are */
      /* checking its contents while copying it to `ttf_data'.  */

      size = (FT_ULong)( limit - parser->root.cursor );

      for ( n = 0; n < string_size; n++ )
      {
        switch ( status )
        {
        case BEFORE_START:
          /* load offset table, 12 bytes */
          if ( count < 12 )
          {
            face->ttf_data[count++] = string_buf[n];
            continue;
          }
          else
          {
            num_tables     = 16 * face->ttf_data[4] + face->ttf_data[5];
            status         = BEFORE_TABLE_DIR;
            face->ttf_size = 12 + 16 * num_tables;

            if ( (FT_Long)size < face->ttf_size )
            {
              FT_ERROR(( "t42_parse_sfnts: invalid data in sfnts array\n" ));
              error = FT_THROW( Invalid_File_Format );
              goto Fail;
            }

            if ( FT_REALLOC( face->ttf_data, 12, face->ttf_size ) )
              goto Fail;
          }
          /* fall through */

        case BEFORE_TABLE_DIR:
          /* the offset table is read; read the table directory */
          if ( count < face->ttf_size )
          {
            face->ttf_data[count++] = string_buf[n];
            continue;
          }
          else
          {
            int       i;
            FT_ULong  len;


            for ( i = 0; i < num_tables; i++ )
            {
              FT_Byte*  p = face->ttf_data + 12 + 16 * i + 12;


              len = FT_PEEK_ULONG( p );
              if ( len > size                               ||
                   face->ttf_size > (FT_Long)( size - len ) )
              {
                FT_ERROR(( "t42_parse_sfnts:"
                           " invalid data in sfnts array\n" ));
                error = FT_THROW( Invalid_File_Format );
                goto Fail;
              }

              /* Pad to a 4-byte boundary length */
              face->ttf_size += (FT_Long)( ( len + 3 ) & ~3U );
            }

            status = OTHER_TABLES;

            if ( FT_REALLOC( face->ttf_data, 12 + 16 * num_tables,
                             face->ttf_size + 1 ) )
              goto Fail;
          }
          /* fall through */

        case OTHER_TABLES:
          /* all other tables are just copied */
          if ( count >= face->ttf_size )
          {
            FT_ERROR(( "t42_parse_sfnts: too much binary data\n" ));
            error = FT_THROW( Invalid_File_Format );
            goto Fail;
          }
          face->ttf_data[count++] = string_buf[n];
        }
      }

      T1_Skip_Spaces( parser );
    }

    /* if control reaches this point, the format was not valid */
    error = FT_THROW( Invalid_File_Format );

  Fail:
    parser->root.error = error;

  Exit:
    if ( allocated )
      FT_FREE( string_buf );
  }